

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

cni_holder_base *
cs_impl::cni::
construct_helper<std::_List_iterator<cs_impl::any>(*)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,std::_List_iterator<cs_impl::any>&,cs_impl::any_const&)>
::
_construct<std::_List_iterator<cs_impl::any>(&)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,std::_List_iterator<cs_impl::any>&,cs_impl::any_const&),std::_List_iterator<cs_impl::any>,std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,std::_List_iterator<cs_impl::any>&,cs_impl::any_const&>
          (_func__List_iterator<cs_impl::any>_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr__List_iterator<cs_impl::any>_ptr_any_ptr
           *val,_func__List_iterator<cs_impl::any>_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr__List_iterator<cs_impl::any>_ptr_any_ptr
                *target_function)

{
  cni_holder<std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&),_std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&)>
  *this;
  _func__List_iterator<cs_impl::any>_list<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr__List_iterator<cs_impl::any>_ptr_any_ptr
  *local_18;
  
  this = (cni_holder<std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&),_std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&)>
          *)operator_new(0x28);
  local_18 = val;
  cni_holder<std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&),_std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&)>
  ::cni_holder(this,&local_18);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}